

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O1

void restore_attrib(void)

{
  int iVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar1 = (int)u.abon.a[4];
  iVar4 = (int)u.acurr.a[4];
  lVar5 = 0;
  do {
    cVar3 = u.atemp.a[lVar5];
    if (cVar3 != '\0') {
      cVar2 = u.atime.a[lVar5];
      if (cVar2 != '\0') {
        cVar2 = cVar2 + -1;
        u.atime.a[lVar5] = cVar2;
        if (cVar2 == '\0') {
          cVar3 = (-('\0' < cVar3) | 1U) + cVar3;
          u.atemp.a[lVar5] = cVar3;
          if (cVar3 != '\0') {
            uVar6 = (int)u.atemp.a[4] + iVar4 + iVar1;
            if ((int)uVar6 < 4) {
              uVar6 = 3;
            }
            uVar7 = (ulong)uVar6;
            if (0x18 < (int)uVar6) {
              uVar7 = 0x19;
            }
            u.atime.a[lVar5] = (schar)(100 / uVar7);
          }
        }
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  encumber_msg();
  return;
}

Assistant:

void restore_attrib(void)
{
	int	i;

	for (i = 0; i < A_MAX; i++) {	/* all temporary losses/gains */

	   if (ATEMP(i) && ATIME(i)) {
		if (!(--(ATIME(i)))) { /* countdown for change */
		    ATEMP(i) += ATEMP(i) > 0 ? -1 : 1;

		    if (ATEMP(i)) /* reset timer */
			ATIME(i) = 100 / ACURR(A_CON);
		}
	    }
	}
	encumber_msg();
}